

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sql_statement.hpp
# Opt level: O0

CreateStatement * __thiscall duckdb::SQLStatement::Cast<duckdb::CreateStatement>(SQLStatement *this)

{
  string *msg;
  CreateStatement *in_RDI;
  allocator *this_00;
  allocator aStack_29;
  string asStack_28 [40];
  
  if ((in_RDI->super_SQLStatement).type != CREATE_STATEMENT) {
    msg = (string *)__cxa_allocate_exception(0x10);
    this_00 = &aStack_29;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (asStack_28,"Failed to cast statement to type - statement type mismatch",this_00);
    InternalException::InternalException((InternalException *)this_00,msg);
    __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return in_RDI;
}

Assistant:

TARGET &Cast() {
		if (type != TARGET::TYPE && TARGET::TYPE != StatementType::INVALID_STATEMENT) {
			throw InternalException("Failed to cast statement to type - statement type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}